

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O1

void * lzham::lzham_malloc(lzham_malloc_context context,size_t size,size_t *pActual_size)

{
  uint uVar1;
  ulong in_RAX;
  void *pvVar2;
  uint uVar3;
  char *pExp;
  ulong uVar4;
  ulong uVar5;
  size_t actual_size;
  ulong local_28;
  
  local_28 = in_RAX;
  if (context == (lzham_malloc_context)0x0) {
    lzham_assert("context",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                 ,0x10f);
  }
  uVar4 = size + 3 & 0xfffffffffffffffc;
  uVar5 = 4;
  if (uVar4 != 0) {
    uVar5 = uVar4;
  }
  if (0x400000000 < uVar5) {
    pExp = "lzham_malloc: size too big";
    goto LAB_00113310;
  }
  local_28 = uVar5;
  if (*context != 0x5749abcd) {
    lzham_assert("pContext->m_sig == malloc_context::cSig",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                 ,0x120);
  }
  if (uVar5 < 0x8000 && *(int *)((long)context + 4) != 0) {
    uVar1 = *(uint *)((long)context + 0x30);
    uVar3 = (int)uVar5 + 0x1fU & 0xfff0;
    if (*(int *)((long)context + 4) - uVar1 < uVar3) goto LAB_001132bd;
    pvVar2 = (void *)((long)context + (ulong)uVar1 + 0x44);
    *(int *)((long)context + (ulong)uVar1 + 0x40) = (int)uVar5;
    *(uint *)((long)context + 0x30) = uVar3 + uVar1;
  }
  else {
LAB_001132bd:
    pvVar2 = (void *)0x0;
  }
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)(*(code *)g_pRealloc)(0,uVar5,&local_28,1,g_pUser_data);
  }
  if (pActual_size != (size_t *)0x0) {
    *pActual_size = local_28;
  }
  if ((pvVar2 != (void *)0x0) && (uVar5 <= local_28)) {
    return pvVar2;
  }
  pExp = "lzham_malloc: out of memory";
LAB_00113310:
  lzham_assert(pExp,
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
               ,0x98);
  return (void *)0x0;
}

Assistant:

void* lzham_malloc(lzham_malloc_context context, size_t size, size_t* pActual_size)
   {
      LZHAM_VERIFY(context);
      
      size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
      if (!size)
         size = sizeof(uint32);

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error(context, "lzham_malloc: size too big");
         return NULL;
      }

      size_t actual_size = size;
      uint8* p_new;

      malloc_context *pContext = static_cast<malloc_context *>(context);

      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
      if (!p_new)
      {
         p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));
      }

      if (pActual_size)
         *pActual_size = actual_size;

      if ((!p_new) || (actual_size < size))
      {
         lzham_mem_error(context, "lzham_malloc: out of memory");
         return NULL;
      }

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      pContext->update_total_allocated(1, static_cast<int64>(actual_size));
#endif

      return p_new;
   }